

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printbuf.c
# Opt level: O0

int sprintbuf(printbuf *p,char *msg,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_178 [16];
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  char local_c8 [8];
  char buf [128];
  char *pcStack_40;
  int size;
  char *t;
  va_list ap;
  char *msg_local;
  printbuf *p_local;
  
  if (in_AL != '\0') {
    local_148 = in_XMM0_Qa;
    local_138 = in_XMM1_Qa;
    local_128 = in_XMM2_Qa;
    local_118 = in_XMM3_Qa;
    local_108 = in_XMM4_Qa;
    local_f8 = in_XMM5_Qa;
    local_e8 = in_XMM6_Qa;
    local_d8 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_178;
  ap[0]._0_8_ = &stack0x00000008;
  t._4_4_ = 0x30;
  t._0_4_ = 0x10;
  local_168 = in_RDX;
  local_160 = in_RCX;
  local_158 = in_R8;
  local_150 = in_R9;
  ap[0].reg_save_area = msg;
  buf._124_4_ = vsnprintf(local_c8,0x80,msg,&t);
  if (((int)buf._124_4_ < 0) || (0x7f < (int)buf._124_4_)) {
    ap[0].overflow_arg_area = local_178;
    ap[0]._0_8_ = &stack0x00000008;
    t._4_4_ = 0x30;
    t._0_4_ = 0x10;
    buf._124_4_ = vasprintf(&stack0xffffffffffffffc0,(char *)ap[0].reg_save_area,&t);
    if ((int)buf._124_4_ < 0) {
      return -1;
    }
    buf._124_4_ = printbuf_memappend(p,pcStack_40,buf._124_4_);
    free(pcStack_40);
  }
  else {
    buf._124_4_ = printbuf_memappend(p,local_c8,buf._124_4_);
  }
  iVar1._0_1_ = buf[0x7c];
  iVar1._1_1_ = buf[0x7d];
  iVar1._2_1_ = buf[0x7e];
  iVar1._3_1_ = buf[0x7f];
  return iVar1;
}

Assistant:

int sprintbuf(struct printbuf *p, const char *msg, ...)
{
	va_list ap;
	char *t;
	int size;
	char buf[128];

	/* use stack buffer first */
	va_start(ap, msg);
	size = vsnprintf(buf, 128, msg, ap);
	va_end(ap);
	/* if string is greater than stack buffer, then use dynamic string
	 * with vasprintf.  Note: some implementations of vsnprintf return -1
	 * if output is truncated whereas some return the number of bytes that
	 * would have been written - this code handles both cases.
	 */
	if (size < 0 || size > 127)
	{
		va_start(ap, msg);
		if ((size = vasprintf(&t, msg, ap)) < 0)
		{
			va_end(ap);
			return -1;
		}
		va_end(ap);
		size = printbuf_memappend(p, t, size);
		free(t);
	}
	else
	{
		size = printbuf_memappend(p, buf, size);
	}
	return size;
}